

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

bool __thiscall
CoreML::Specification::ReduceLayerParams::MergePartialFromCodedStream
          (ReduceLayerParams *this,CodedInputStream *input)

{
  bool bVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  bool local_91;
  ReduceLayerParams_ReduceAxis local_7c;
  ReduceLayerParams_ReduceOperation local_78;
  int value_1;
  int value;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  ReduceLayerParams *this_local;
  bool local_3d;
  uint32 local_3c [2];
  uint32 tag_1;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
  unique0x10000211 = input;
LAB_008b432b:
  do {
    _first_byte_or_zero = stack0xffffffffffffff98;
    kMax1ByteVarint = 0x7f;
    tag_2 = 0;
    if ((stack0xffffffffffffff98->buffer_ < stack0xffffffffffffff98->buffer_end_) &&
       (tag_2 = (uint32)*stack0xffffffffffffff98->buffer_,
       '\0' < (char)*stack0xffffffffffffff98->buffer_)) {
      local_24 = 0x7f;
      kMax2ByteVarint = (uint32)*stack0xffffffffffffff98->buffer_;
      google::protobuf::io::CodedInputStream::Advance(stack0xffffffffffffff98,1);
      local_91 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
      tag_3._3_1_ = local_91;
      pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    else {
      local_3c[0] = google::protobuf::io::CodedInputStream::ReadTagFallback
                              (stack0xffffffffffffff98,tag_2);
      local_3d = local_3c[0] - 1 < kMax1ByteVarint;
      pVar4 = std::make_pair<unsigned_int_const&,bool>(local_3c,&local_3d);
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    value._0_1_ = (undefined1)uStack_c;
    value_1 = local_10;
    p.first = value_1;
    if ((uStack_c & 1) == 0) {
LAB_008b45f6:
      if ((p.first == 0) ||
         (WVar3 = google::protobuf::internal::WireFormatLite::GetTagWireType(p.first),
         WVar3 == WIRETYPE_END_GROUP)) {
        return true;
      }
      bVar1 = google::protobuf::internal::WireFormatLite::SkipField(stack0xffffffffffffff98,p.first)
      ;
    }
    else {
      iVar2 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10);
      if (iVar2 == 1) {
        if ((p.first & 0xff) != 8) goto LAB_008b45f6;
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (stack0xffffffffffffff98,&local_78);
        if (!bVar1) {
          return false;
        }
        set_mode(this,local_78);
        goto LAB_008b432b;
      }
      if (iVar2 != 2) {
        if ((iVar2 != 3) || ((p.first & 0xff) != 0x18)) goto LAB_008b45f6;
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (stack0xffffffffffffff98,&local_7c);
        if (!bVar1) {
          return false;
        }
        set_axis(this,local_7c);
        goto LAB_008b432b;
      }
      if ((p.first & 0xff) != 0x15) goto LAB_008b45f6;
      bVar1 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                        (stack0xffffffffffffff98,&this->epsilon_);
    }
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool ReduceLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ReduceLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.ReduceLayerParams.ReduceOperation mode = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_mode(static_cast< ::CoreML::Specification::ReduceLayerParams_ReduceOperation >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float epsilon = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &epsilon_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ReduceLayerParams.ReduceAxis axis = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_axis(static_cast< ::CoreML::Specification::ReduceLayerParams_ReduceAxis >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ReduceLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ReduceLayerParams)
  return false;
#undef DO_
}